

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZoneNamesImpl::getExemplarLocationName
          (TimeZoneNamesImpl *this,UnicodeString *tzID,UnicodeString *name)

{
  UBool UVar1;
  ZNames *this_00;
  ConstChar16Ptr local_68;
  uint local_60;
  UErrorCode local_4c;
  UErrorCode status;
  Mutex lock;
  TimeZoneNamesImpl *nonConstThis;
  ZNames *tznames;
  UChar *locName;
  UnicodeString *name_local;
  UnicodeString *tzID_local;
  TimeZoneNamesImpl *this_local;
  
  UnicodeString::setToBogus(name);
  tznames = (ZNames *)0x0;
  lock.fMutex = (UMutex *)this;
  Mutex::Mutex((Mutex *)&stack0xffffffffffffffb8,(UMutex *)gDataMutex);
  local_4c = U_ZERO_ERROR;
  this_00 = loadTimeZoneNames((TimeZoneNamesImpl *)lock.fMutex,tzID,&local_4c);
  UVar1 = ::U_FAILURE(local_4c);
  if (UVar1 != '\0') {
    this_local = (TimeZoneNamesImpl *)name;
  }
  local_60 = (uint)(UVar1 != '\0');
  Mutex::~Mutex((Mutex *)&stack0xffffffffffffffb8);
  if (local_60 == 0) {
    if (this_00 != (ZNames *)0x0) {
      tznames = (ZNames *)ZNames::getName(this_00,UTZNM_EXEMPLAR_LOCATION);
    }
    this_local = (TimeZoneNamesImpl *)name;
    if (tznames != (ZNames *)0x0) {
      ConstChar16Ptr::ConstChar16Ptr(&local_68,(char16_t *)tznames);
      UnicodeString::setTo(name,'\x01',&local_68,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_68);
    }
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
TimeZoneNamesImpl::getExemplarLocationName(const UnicodeString& tzID, UnicodeString& name) const {
    name.setToBogus();  // cleanup result.
    const UChar* locName = NULL;
    ZNames *tznames = NULL;
    TimeZoneNamesImpl *nonConstThis = const_cast<TimeZoneNamesImpl *>(this);

    {
        Mutex lock(&gDataMutex);
        UErrorCode status = U_ZERO_ERROR;
        tznames = nonConstThis->loadTimeZoneNames(tzID, status);
        if (U_FAILURE(status)) { return name; }
    }

    if (tznames != NULL) {
        locName = tznames->getName(UTZNM_EXEMPLAR_LOCATION);
    }
    if (locName != NULL) {
        name.setTo(TRUE, locName, -1);
    }

    return name;
}